

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::dtime_tz_t,duckdb::interval_t,duckdb::dtime_tz_t,duckdb::BinaryStandardOperatorWrapper,duckdb::SubtractTimeOperator,bool,true,false>
               (dtime_tz_t *ldata,interval_t *rdata,dtime_tz_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  Interval *pIVar2;
  dtime_tz_t left;
  dtime_tz_t left_00;
  dtime_tz_t dVar3;
  ulong uVar4;
  int64_t *piVar5;
  idx_t iVar6;
  dtime_tz_t lentry_1;
  ulong uVar7;
  ulong uVar8;
  dtime_tz_t lentry;
  unsigned_long uVar9;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  int64_t *local_78;
  undefined4 local_64;
  undefined4 local_60;
  undefined4 local_5c;
  ulong local_58;
  dtime_tz_t *local_50;
  ulong local_48;
  ValidityMask *local_40;
  ulong local_38;
  
  local_40 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      pIVar2 = (Interval *)ldata->bits;
      local_78 = &rdata->micros;
      iVar6 = 0;
      do {
        dVar3.bits._0_4_ = ((interval_t *)(local_78 + -1))->months;
        dVar3.bits._4_4_ = ((interval_t *)(local_78 + -1))->days;
        local_5c = 0;
        right_01.micros = (int64_t)&local_5c;
        right_01._0_8_ = -*local_78;
        dVar3 = Interval::Add(pIVar2,dVar3,right_01,(date_t *)mask);
        result_data[iVar6].bits = dVar3.bits;
        iVar6 = iVar6 + 1;
        local_78 = local_78 + 2;
      } while (count != iVar6);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_58 = count + 0x3f >> 6;
    local_38 = 0;
    uVar7 = 0;
    local_50 = result_data;
    local_48 = count;
    do {
      puVar1 = (local_40->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar9 = 0xffffffffffffffff;
      }
      else {
        uVar9 = puVar1[local_38];
      }
      uVar4 = uVar7 + 0x40;
      if (local_48 <= uVar7 + 0x40) {
        uVar4 = local_48;
      }
      uVar8 = uVar4;
      if (uVar9 != 0) {
        uVar8 = uVar7;
        if (uVar9 == 0xffffffffffffffff) {
          if (uVar7 < uVar4) {
            pIVar2 = (Interval *)ldata->bits;
            piVar5 = &rdata[uVar7].micros;
            do {
              left.bits._0_4_ = ((interval_t *)(piVar5 + -1))->months;
              left.bits._4_4_ = ((interval_t *)(piVar5 + -1))->days;
              local_64 = 0;
              right.micros = (int64_t)&local_64;
              right._0_8_ = -*piVar5;
              dVar3 = Interval::Add(pIVar2,left,right,(date_t *)mask);
              result_data[uVar8].bits = dVar3.bits;
              uVar8 = uVar8 + 1;
              piVar5 = piVar5 + 2;
            } while (uVar4 != uVar8);
          }
        }
        else if (uVar7 < uVar4) {
          piVar5 = &rdata[uVar7].micros;
          uVar8 = 0;
          do {
            if ((uVar9 >> (uVar8 & 0x3f) & 1) != 0) {
              left_00.bits._0_4_ = ((interval_t *)(piVar5 + -1))->months;
              left_00.bits._4_4_ = ((interval_t *)(piVar5 + -1))->days;
              local_60 = 0;
              right_00.micros = (int64_t)&local_60;
              right_00._0_8_ = -*piVar5;
              dVar3 = Interval::Add((Interval *)ldata->bits,left_00,right_00,(date_t *)mask);
              result_data[uVar7 + uVar8].bits = dVar3.bits;
            }
            uVar8 = uVar8 + 1;
            piVar5 = piVar5 + 2;
          } while ((uVar7 - uVar4) + uVar8 != 0);
          result_data = local_50;
          uVar8 = uVar7 + uVar8;
        }
      }
      local_38 = local_38 + 1;
      uVar7 = uVar8;
    } while (local_38 != local_58);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}